

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  long lVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  bool bVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong *puVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  Geometry *geometry;
  bool bVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  vint4 ai_1;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  float fVar62;
  float fVar65;
  float fVar66;
  vint4 ai_3;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar67;
  vint4 ai;
  undefined1 auVar68 [16];
  vint4 ai_2;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  vint4 ai_4;
  undefined1 auVar74 [16];
  vint4 ai_6;
  undefined1 auVar75 [16];
  float fVar76;
  float fVar78;
  float fVar79;
  undefined1 auVar77 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar83;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar84 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [244];
  RTCFilterFunctionNArguments local_b50;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  byte local_9ff;
  float local_9e0 [4];
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  float local_9c0 [4];
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  float local_9a0 [4];
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  uint uStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [32];
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar25 = local_7f8;
  local_800 = root.ptr;
  auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar92 = ZEXT1664(auVar34);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar93 = ZEXT1664(auVar35);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x40)));
  auVar94 = ZEXT1664(auVar36);
  auVar34 = vmulss_avx512f(auVar34,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar37._0_4_ = auVar34._0_4_;
  auVar37._4_4_ = auVar37._0_4_;
  auVar37._8_4_ = auVar37._0_4_;
  auVar37._12_4_ = auVar37._0_4_;
  auVar34 = vmulss_avx512f(auVar35,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar35 = vmulss_avx512f(auVar36,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x40)));
  auVar36._0_4_ = auVar34._0_4_;
  auVar36._4_4_ = auVar36._0_4_;
  auVar36._8_4_ = auVar36._0_4_;
  auVar36._12_4_ = auVar36._0_4_;
  auVar35._4_4_ = auVar35._0_4_;
  auVar35._8_4_ = auVar35._0_4_;
  auVar35._12_4_ = auVar35._0_4_;
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  auVar69._8_4_ = 0x80000000;
  auVar69._0_8_ = 0x8000000080000000;
  auVar69._12_4_ = 0x80000000;
  auVar34 = vxorps_avx512vl(auVar37,auVar69);
  auVar95 = ZEXT1664(auVar34);
  auVar34 = vxorps_avx512vl(auVar36,auVar69);
  auVar96 = ZEXT1664(auVar34);
  auVar34 = vxorps_avx512vl(auVar35,auVar69);
  auVar97 = ZEXT1664(auVar34);
  auVar34 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar98 = ZEXT1664(auVar34);
  auVar34 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar99 = ZEXT1664(auVar34);
  auVar41 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar100 = ZEXT3264(auVar41);
  auVar34 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
  auVar101 = ZEXT1664(auVar34);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar102 = ZEXT3264(auVar41);
  bVar16 = true;
  do {
    uVar31 = puVar25[-1];
    puVar25 = puVar25 + -1;
    while ((uVar31 & 8) == 0) {
      auVar34 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar31 + 0x20 + uVar26),auVar95._0_16_,
                           auVar92._0_16_);
      auVar35 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar31 + 0x20 + uVar27),auVar96._0_16_,
                           auVar93._0_16_);
      auVar34 = vpmaxsd_avx(auVar34,auVar35);
      auVar36 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar31 + 0x20 + uVar28),auVar97._0_16_,
                           auVar94._0_16_);
      auVar35 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar31 + 0x20 + (uVar26 ^ 0x10)),auVar95._0_16_,
                           auVar92._0_16_);
      auVar37 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar31 + 0x20 + (uVar27 ^ 0x10)),auVar96._0_16_,
                           auVar93._0_16_);
      auVar35 = vpminsd_avx(auVar35,auVar37);
      auVar37 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar31 + 0x20 + (uVar28 ^ 0x10)),auVar97._0_16_,
                           auVar94._0_16_);
      auVar36 = vpmaxsd_avx512vl(auVar36,auVar98._0_16_);
      auVar34 = vpmaxsd_avx(auVar34,auVar36);
      auVar36 = vpminsd_avx512vl(auVar37,auVar99._0_16_);
      auVar35 = vpminsd_avx(auVar35,auVar36);
      uVar33 = vpcmpd_avx512vl(auVar34,auVar35,2);
      uVar33 = uVar33 & 0xf;
      if ((char)uVar33 == '\0') goto joined_r0x0075ccab;
      uVar17 = uVar31 & 0xfffffffffffffff0;
      lVar19 = 0;
      for (uVar31 = uVar33; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
        lVar19 = lVar19 + 1;
      }
      uVar31 = *(ulong *)(uVar17 + lVar19 * 8);
      uVar20 = (uint)uVar33 - 1 & (uint)uVar33;
      uVar33 = (ulong)uVar20;
      if (uVar20 != 0) {
        *puVar25 = uVar31;
        lVar19 = 0;
        for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
          lVar19 = lVar19 + 1;
        }
        uVar20 = uVar20 - 1 & uVar20;
        uVar33 = (ulong)uVar20;
        bVar32 = uVar20 == 0;
        while( true ) {
          puVar25 = puVar25 + 1;
          uVar31 = *(ulong *)(uVar17 + lVar19 * 8);
          if (bVar32) break;
          *puVar25 = uVar31;
          lVar19 = 0;
          for (uVar31 = uVar33; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar19 = lVar19 + 1;
          }
          uVar33 = uVar33 - 1 & uVar33;
          bVar32 = uVar33 == 0;
        }
      }
    }
    uVar33 = (ulong)((uint)uVar31 & 0xf);
    if (uVar33 != 8) {
      uVar31 = uVar31 & 0xfffffffffffffff0;
      lVar19 = 0;
      do {
        lVar18 = lVar19 * 0x58;
        lVar1 = uVar31 + lVar18;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)(uVar31 + 0x20 + lVar18);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)(uVar31 + 0x24 + lVar18);
        uVar10 = vpcmpub_avx512vl(auVar34,auVar40,2);
        uVar2 = *(undefined4 *)(uVar31 + 0x38 + lVar18);
        auVar57._4_4_ = uVar2;
        auVar57._0_4_ = uVar2;
        auVar57._8_4_ = uVar2;
        auVar57._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(uVar31 + 0x44 + lVar18);
        auVar39._4_4_ = uVar2;
        auVar39._0_4_ = uVar2;
        auVar39._8_4_ = uVar2;
        auVar39._12_4_ = uVar2;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = *(ulong *)((uVar26 >> 2) + 0x20 + lVar1);
        auVar34 = vpmovzxbd_avx(auVar68);
        auVar34 = vcvtdq2ps_avx(auVar34);
        auVar35 = vfmadd213ps_fma(auVar34,auVar39,auVar57);
        auVar70._8_8_ = 0;
        auVar70._0_8_ = *(ulong *)(((uVar26 ^ 0x10) >> 2) + 0x20 + lVar1);
        auVar34 = vpmovzxbd_avx(auVar70);
        auVar34 = vcvtdq2ps_avx(auVar34);
        auVar36 = vfmadd213ps_fma(auVar34,auVar39,auVar57);
        uVar2 = *(undefined4 *)(uVar31 + 0x3c + lVar18);
        auVar58._4_4_ = uVar2;
        auVar58._0_4_ = uVar2;
        auVar58._8_4_ = uVar2;
        auVar58._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(uVar31 + 0x48 + lVar18);
        auVar38._4_4_ = uVar2;
        auVar38._0_4_ = uVar2;
        auVar38._8_4_ = uVar2;
        auVar38._12_4_ = uVar2;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = *(ulong *)((uVar27 >> 2) + 0x20 + lVar1);
        auVar34 = vpmovzxbd_avx(auVar72);
        auVar34 = vcvtdq2ps_avx(auVar34);
        auVar37 = vfmadd213ps_fma(auVar34,auVar38,auVar58);
        auVar73._8_8_ = 0;
        auVar73._0_8_ = *(ulong *)(((uVar27 ^ 0x10) >> 2) + 0x20 + lVar1);
        auVar34 = vpmovzxbd_avx(auVar73);
        auVar34 = vcvtdq2ps_avx(auVar34);
        auVar69 = vfmadd213ps_fma(auVar34,auVar38,auVar58);
        uVar2 = *(undefined4 *)(uVar31 + 0x40 + lVar18);
        auVar59._4_4_ = uVar2;
        auVar59._0_4_ = uVar2;
        auVar59._8_4_ = uVar2;
        auVar59._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(uVar31 + 0x4c + lVar18);
        auVar63._4_4_ = uVar2;
        auVar63._0_4_ = uVar2;
        auVar63._8_4_ = uVar2;
        auVar63._12_4_ = uVar2;
        auVar74._8_8_ = 0;
        auVar74._0_8_ = *(ulong *)((uVar28 >> 2) + 0x20 + lVar1);
        auVar34 = vpmovzxbd_avx(auVar74);
        auVar34 = vcvtdq2ps_avx(auVar34);
        auVar57 = vfmadd213ps_fma(auVar34,auVar63,auVar59);
        auVar75._8_8_ = 0;
        auVar75._0_8_ = *(ulong *)(((uVar28 ^ 0x10) >> 2) + 0x20 + lVar1);
        auVar34 = vpmovzxbd_avx(auVar75);
        auVar34 = vcvtdq2ps_avx(auVar34);
        auVar58 = vfmadd213ps_fma(auVar34,auVar63,auVar59);
        auVar34 = vfmadd213ps_avx512vl(auVar35,auVar92._0_16_,auVar95._0_16_);
        auVar35 = vfmadd213ps_avx512vl(auVar37,auVar93._0_16_,auVar96._0_16_);
        auVar34 = vpmaxsd_avx(auVar34,auVar35);
        auVar37 = vfmadd213ps_avx512vl(auVar57,auVar94._0_16_,auVar97._0_16_);
        auVar35 = vfmadd213ps_avx512vl(auVar36,auVar92._0_16_,auVar95._0_16_);
        auVar36 = vfmadd213ps_avx512vl(auVar69,auVar93._0_16_,auVar96._0_16_);
        auVar35 = vpminsd_avx(auVar35,auVar36);
        auVar36 = vfmadd213ps_avx512vl(auVar58,auVar94._0_16_,auVar97._0_16_);
        auVar37 = vpmaxsd_avx512vl(auVar37,auVar98._0_16_);
        auVar34 = vpmaxsd_avx(auVar34,auVar37);
        auVar36 = vpminsd_avx512vl(auVar36,auVar99._0_16_);
        auVar35 = vpminsd_avx(auVar35,auVar36);
        uVar17 = vpcmpd_avx512vl(auVar34,auVar35,2);
        uVar17 = ((byte)uVar10 & 0xf) & uVar17;
        if ((char)uVar17 != '\0') {
          do {
            lVar18 = 0;
            for (uVar22 = uVar17; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              lVar18 = lVar18 + 1;
            }
            pGVar3 = (context->scene->geometries).items[*(uint *)(lVar1 + 0x50)].ptr;
            lVar4 = *(long *)&pGVar3->field_0x58;
            lVar5 = *(long *)&pGVar3[1].time_range.upper;
            lVar24 = pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                     (ulong)*(uint *)(lVar1 + 4 + lVar18 * 8);
            uVar22 = *(ulong *)(lVar1 + lVar18 * 8);
            auVar60._8_8_ = 0;
            auVar60._0_8_ = uVar22;
            auVar34 = vpandq_avx512vl(auVar60,auVar101._0_16_);
            auVar57 = vpmovzxwd_avx(auVar34);
            auVar64._8_8_ = 0;
            auVar64._0_8_ = *(ulong *)(lVar4 + lVar24);
            auVar34 = vpaddd_avx(auVar64,auVar57);
            auVar35 = vpmulld_avx(auVar64,auVar57);
            auVar35 = vpsrlq_avx(auVar35,0x20);
            auVar34 = vpaddd_avx(auVar34,auVar35);
            lVar23 = CONCAT44((int)((ulong)lVar1 >> 0x20),auVar34._0_4_);
            p_Var6 = pGVar3[1].intersectionFilterN;
            auVar34 = *(undefined1 (*) [16])(lVar5 + (lVar23 + 1) * (long)p_Var6);
            uVar29 = *(ulong *)(lVar4 + lVar24) >> 0x20;
            lVar30 = lVar23 + uVar29 + 1;
            auVar35 = *(undefined1 (*) [16])(lVar5 + (lVar23 + uVar29) * (long)p_Var6);
            auVar36 = *(undefined1 (*) [16])(lVar5 + lVar30 * (long)p_Var6);
            uVar21 = (ulong)(-1 < (short)uVar22);
            auVar37 = *(undefined1 (*) [16])(lVar5 + (lVar23 + uVar21 + 1) * (long)p_Var6);
            lVar18 = uVar21 + lVar30;
            auVar69 = *(undefined1 (*) [16])(lVar5 + lVar18 * (long)p_Var6);
            uVar21 = 0;
            if (-1 < (short)(uVar22 >> 0x10)) {
              uVar21 = uVar29;
            }
            auVar58 = *(undefined1 (*) [16])(lVar5 + (lVar23 + uVar29 + uVar21) * (long)p_Var6);
            auVar59 = *(undefined1 (*) [16])(lVar5 + (lVar30 + uVar21) * (long)p_Var6);
            auVar80._16_16_ = *(undefined1 (*) [16])(lVar5 + (uVar21 + lVar18) * (long)p_Var6);
            auVar80._0_16_ = auVar36;
            auVar39 = vunpcklps_avx(auVar34,auVar69);
            auVar40 = vunpckhps_avx(auVar34,auVar69);
            auVar38 = vunpcklps_avx(auVar37,auVar36);
            auVar37 = vunpckhps_avx(auVar37,auVar36);
            auVar63 = vunpcklps_avx(auVar40,auVar37);
            auVar68 = vunpcklps_avx(auVar39,auVar38);
            auVar37 = vunpckhps_avx(auVar39,auVar38);
            auVar39 = vunpcklps_avx(auVar35,auVar59);
            auVar40 = vunpckhps_avx(auVar35,auVar59);
            auVar38 = vunpcklps_avx(auVar36,auVar58);
            auVar58 = vunpckhps_avx(auVar36,auVar58);
            auVar40 = vunpcklps_avx(auVar40,auVar58);
            auVar70 = vunpcklps_avx(auVar39,auVar38);
            auVar58 = vunpckhps_avx(auVar39,auVar38);
            auVar52._16_16_ = auVar59;
            auVar52._0_16_ = auVar35;
            auVar53._16_16_ = auVar69;
            auVar53._0_16_ = auVar34;
            auVar41 = vunpcklps_avx(auVar53,auVar52);
            auVar54._16_16_ = auVar36;
            auVar54._0_16_ = *(undefined1 (*) [16])(lVar5 + (long)p_Var6 * lVar23);
            auVar55 = vunpcklps_avx(auVar54,auVar80);
            auVar45 = vunpcklps_avx(auVar55,auVar41);
            auVar46 = vunpckhps_avx(auVar55,auVar41);
            auVar41 = vunpckhps_avx(auVar53,auVar52);
            auVar55 = vunpckhps_avx(auVar54,auVar80);
            auVar47 = vunpcklps_avx(auVar55,auVar41);
            auVar41._16_16_ = auVar68;
            auVar41._0_16_ = auVar68;
            auVar55._16_16_ = auVar37;
            auVar55._0_16_ = auVar37;
            auVar51._16_16_ = auVar63;
            auVar51._0_16_ = auVar63;
            auVar49._16_16_ = auVar70;
            auVar49._0_16_ = auVar70;
            auVar81._16_16_ = auVar58;
            auVar81._0_16_ = auVar58;
            auVar50._16_16_ = auVar40;
            auVar50._0_16_ = auVar40;
            auVar41 = vsubps_avx(auVar45,auVar41);
            auVar55 = vsubps_avx(auVar46,auVar55);
            auVar54 = vsubps_avx(auVar47,auVar51);
            auVar53 = vsubps_avx(auVar49,auVar45);
            auVar52 = vsubps_avx(auVar81,auVar46);
            auVar51 = vsubps_avx(auVar50,auVar47);
            auVar42._4_4_ = auVar55._4_4_ * auVar51._4_4_;
            auVar42._0_4_ = auVar55._0_4_ * auVar51._0_4_;
            auVar42._8_4_ = auVar55._8_4_ * auVar51._8_4_;
            auVar42._12_4_ = auVar55._12_4_ * auVar51._12_4_;
            auVar42._16_4_ = auVar55._16_4_ * auVar51._16_4_;
            auVar42._20_4_ = auVar55._20_4_ * auVar51._20_4_;
            auVar42._24_4_ = auVar55._24_4_ * auVar51._24_4_;
            auVar42._28_4_ = auVar37._12_4_;
            auVar34 = vfmsub231ps_fma(auVar42,auVar52,auVar54);
            auVar43._4_4_ = auVar54._4_4_ * auVar53._4_4_;
            auVar43._0_4_ = auVar54._0_4_ * auVar53._0_4_;
            auVar43._8_4_ = auVar54._8_4_ * auVar53._8_4_;
            auVar43._12_4_ = auVar54._12_4_ * auVar53._12_4_;
            auVar43._16_4_ = auVar54._16_4_ * auVar53._16_4_;
            auVar43._20_4_ = auVar54._20_4_ * auVar53._20_4_;
            auVar43._24_4_ = auVar54._24_4_ * auVar53._24_4_;
            auVar43._28_4_ = auVar63._12_4_;
            auVar35 = vfmsub231ps_fma(auVar43,auVar51,auVar41);
            auVar48._4_4_ = auVar41._4_4_ * auVar52._4_4_;
            auVar48._0_4_ = auVar41._0_4_ * auVar52._0_4_;
            auVar48._8_4_ = auVar41._8_4_ * auVar52._8_4_;
            auVar48._12_4_ = auVar41._12_4_ * auVar52._12_4_;
            auVar48._16_4_ = auVar41._16_4_ * auVar52._16_4_;
            auVar48._20_4_ = auVar41._20_4_ * auVar52._20_4_;
            auVar48._24_4_ = auVar41._24_4_ * auVar52._24_4_;
            auVar48._28_4_ = auVar70._12_4_;
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar84._4_4_ = uVar2;
            auVar84._0_4_ = uVar2;
            auVar84._8_4_ = uVar2;
            auVar84._12_4_ = uVar2;
            auVar84._16_4_ = uVar2;
            auVar84._20_4_ = uVar2;
            auVar84._24_4_ = uVar2;
            auVar84._28_4_ = uVar2;
            auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
            auVar43 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
            uVar2 = *(undefined4 *)(ray + k * 4);
            auVar44._4_4_ = uVar2;
            auVar44._0_4_ = uVar2;
            auVar44._8_4_ = uVar2;
            auVar44._12_4_ = uVar2;
            auVar44._16_4_ = uVar2;
            auVar44._20_4_ = uVar2;
            auVar44._24_4_ = uVar2;
            auVar44._28_4_ = uVar2;
            auVar44 = vsubps_avx512vl(auVar45,auVar44);
            auVar36 = vfmsub231ps_fma(auVar48,auVar53,auVar55);
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
            auVar45._4_4_ = uVar2;
            auVar45._0_4_ = uVar2;
            auVar45._8_4_ = uVar2;
            auVar45._12_4_ = uVar2;
            auVar45._16_4_ = uVar2;
            auVar45._20_4_ = uVar2;
            auVar45._24_4_ = uVar2;
            auVar45._28_4_ = uVar2;
            auVar45 = vsubps_avx512vl(auVar46,auVar45);
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
            auVar46._4_4_ = uVar2;
            auVar46._0_4_ = uVar2;
            auVar46._8_4_ = uVar2;
            auVar46._12_4_ = uVar2;
            auVar46._16_4_ = uVar2;
            auVar46._20_4_ = uVar2;
            auVar46._24_4_ = uVar2;
            auVar46._28_4_ = uVar2;
            auVar46 = vsubps_avx512vl(auVar47,auVar46);
            auVar47 = vmulps_avx512vl(auVar42,auVar46);
            auVar48 = vfmsub231ps_avx512vl(auVar47,auVar45,auVar43);
            auVar47 = vmulps_avx512vl(auVar43,auVar44);
            auVar49 = vfmsub231ps_avx512vl(auVar47,auVar46,auVar84);
            auVar47 = vmulps_avx512vl(auVar84,auVar45);
            auVar50 = vfmsub231ps_avx512vl(auVar47,auVar44,auVar42);
            auVar47 = vmulps_avx512vl(ZEXT1632(auVar36),auVar43);
            auVar47 = vfmadd231ps_avx512vl(auVar47,ZEXT1632(auVar35),auVar42);
            local_a20 = vfmadd231ps_avx512vl(auVar47,ZEXT1632(auVar34),auVar84);
            vandps_avx512vl(local_a20,auVar102._0_32_);
            auVar47._8_4_ = 0x80000000;
            auVar47._0_8_ = 0x8000000080000000;
            auVar47._12_4_ = 0x80000000;
            auVar47._16_4_ = 0x80000000;
            auVar47._20_4_ = 0x80000000;
            auVar47._24_4_ = 0x80000000;
            auVar47._28_4_ = 0x80000000;
            vandps_avx512vl(local_a20,auVar47);
            auVar51 = vmulps_avx512vl(auVar51,auVar50);
            auVar52 = vfmadd231ps_avx512vl(auVar51,auVar49,auVar52);
            auVar53 = vfmadd231ps_avx512vl(auVar52,auVar48,auVar53);
            fVar83 = local_a20._0_4_;
            auVar77._0_4_ = (float)((uint)fVar83 ^ auVar53._0_4_);
            fVar85 = local_a20._4_4_;
            auVar77._4_4_ = (float)((uint)fVar85 ^ auVar53._4_4_);
            fVar86 = local_a20._8_4_;
            auVar77._8_4_ = (float)((uint)fVar86 ^ auVar53._8_4_);
            fVar87 = local_a20._12_4_;
            auVar77._12_4_ = (float)((uint)fVar87 ^ auVar53._12_4_);
            fVar88 = local_a20._16_4_;
            auVar77._16_4_ = (float)((uint)fVar88 ^ auVar53._16_4_);
            fVar89 = local_a20._20_4_;
            auVar77._20_4_ = (float)((uint)fVar89 ^ auVar53._20_4_);
            fVar90 = local_a20._24_4_;
            auVar77._24_4_ = (float)((uint)fVar90 ^ auVar53._24_4_);
            uStack_984 = local_a20._28_4_;
            auVar77._28_4_ = (float)(uStack_984 ^ auVar53._28_4_);
            auVar54 = vmulps_avx512vl(auVar54,auVar50);
            auVar55 = vfmadd231ps_avx512vl(auVar54,auVar55,auVar49);
            auVar41 = vfmadd231ps_avx512vl(auVar55,auVar41,auVar48);
            auVar82._0_4_ = (float)((uint)fVar83 ^ auVar41._0_4_);
            auVar82._4_4_ = (float)((uint)fVar85 ^ auVar41._4_4_);
            auVar82._8_4_ = (float)((uint)fVar86 ^ auVar41._8_4_);
            auVar82._12_4_ = (float)((uint)fVar87 ^ auVar41._12_4_);
            auVar82._16_4_ = (float)((uint)fVar88 ^ auVar41._16_4_);
            auVar82._20_4_ = (float)((uint)fVar89 ^ auVar41._20_4_);
            auVar82._24_4_ = (float)((uint)fVar90 ^ auVar41._24_4_);
            auVar82._28_4_ = (float)(uStack_984 ^ auVar41._28_4_);
            uVar10 = vcmpps_avx512vl(auVar77,ZEXT832(0) << 0x20,5);
            uVar7 = vcmpps_avx512vl(auVar82,ZEXT832(0) << 0x20,5);
            uVar8 = vcmpps_avx512vl(local_a20,ZEXT832(0) << 0x20,4);
            auVar91._0_4_ = auVar77._0_4_ + auVar82._0_4_;
            auVar91._4_4_ = auVar77._4_4_ + auVar82._4_4_;
            auVar91._8_4_ = auVar77._8_4_ + auVar82._8_4_;
            auVar91._12_4_ = auVar77._12_4_ + auVar82._12_4_;
            auVar91._16_4_ = auVar77._16_4_ + auVar82._16_4_;
            auVar91._20_4_ = auVar77._20_4_ + auVar82._20_4_;
            auVar91._24_4_ = auVar77._24_4_ + auVar82._24_4_;
            auVar91._28_4_ = auVar77._28_4_ + auVar82._28_4_;
            uVar9 = vcmpps_avx512vl(auVar91,local_a20,2);
            local_9ff = (byte)uVar10 & (byte)uVar7 & (byte)uVar8 & (byte)uVar9;
            if (local_9ff != 0) {
              auVar13._4_4_ = auVar36._4_4_ * auVar46._4_4_;
              auVar13._0_4_ = auVar36._0_4_ * auVar46._0_4_;
              auVar13._8_4_ = auVar36._8_4_ * auVar46._8_4_;
              auVar13._12_4_ = auVar36._12_4_ * auVar46._12_4_;
              auVar13._16_4_ = auVar46._16_4_ * 0.0;
              auVar13._20_4_ = auVar46._20_4_ * 0.0;
              auVar13._24_4_ = auVar46._24_4_ * 0.0;
              auVar13._28_4_ = auVar46._28_4_;
              auVar37 = vfmadd213ps_fma(auVar45,ZEXT1632(auVar35),auVar13);
              auVar37 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar34),ZEXT1632(auVar37));
              local_a40._0_4_ = (float)((uint)fVar83 ^ auVar37._0_4_);
              local_a40._4_4_ = (float)((uint)fVar85 ^ auVar37._4_4_);
              local_a40._8_4_ = (float)((uint)fVar86 ^ auVar37._8_4_);
              local_a40._12_4_ = (float)((uint)fVar87 ^ auVar37._12_4_);
              local_a40._16_4_ = fVar88;
              local_a40._20_4_ = fVar89;
              local_a40._24_4_ = fVar90;
              local_a40._28_4_ = uStack_984;
              uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
              auVar11._4_4_ = uVar2;
              auVar11._0_4_ = uVar2;
              auVar11._8_4_ = uVar2;
              auVar11._12_4_ = uVar2;
              auVar11._16_4_ = uVar2;
              auVar11._20_4_ = uVar2;
              auVar11._24_4_ = uVar2;
              auVar11._28_4_ = uVar2;
              auVar41 = vmulps_avx512vl(local_a20,auVar11);
              uVar10 = vcmpps_avx512vl(auVar41,local_a40,1);
              local_ae0 = *(float *)(ray + k * 4 + 0x100);
              auVar14._4_4_ = local_ae0 * fVar85;
              auVar14._0_4_ = local_ae0 * fVar83;
              auVar14._8_4_ = local_ae0 * fVar86;
              auVar14._12_4_ = local_ae0 * fVar87;
              auVar14._16_4_ = local_ae0 * fVar88;
              auVar14._20_4_ = local_ae0 * fVar89;
              auVar14._24_4_ = local_ae0 * fVar90;
              auVar14._28_4_ = auVar41._28_4_;
              uVar7 = vcmpps_avx512vl(local_a40,auVar14,2);
              local_9ff = (byte)uVar10 & (byte)uVar7 & local_9ff;
              if (local_9ff != 0) {
                auVar41 = vsubps_avx(local_a20,auVar82);
                local_a80 = vblendps_avx(auVar77,auVar41,0xf0);
                auVar41 = vsubps_avx(local_a20,auVar77);
                local_a60 = vblendps_avx(auVar82,auVar41,0xf0);
                fVar76 = (float)DAT_01fef940;
                local_980._0_4_ = fVar76 * auVar34._0_4_;
                fVar78 = DAT_01fef940._4_4_;
                local_980._4_4_ = fVar78 * auVar34._4_4_;
                fVar62 = DAT_01fef940._8_4_;
                local_980._8_4_ = fVar62 * auVar34._8_4_;
                fVar65 = DAT_01fef940._12_4_;
                local_980._12_4_ = fVar65 * auVar34._12_4_;
                fVar66 = DAT_01fef940._16_4_;
                local_980._16_4_ = fVar66 * 0.0;
                fVar67 = DAT_01fef940._20_4_;
                local_980._20_4_ = fVar67 * 0.0;
                fVar79 = DAT_01fef940._24_4_;
                local_980._24_4_ = fVar79 * 0.0;
                local_980._28_4_ = 0;
                local_960._4_4_ = fVar78 * auVar35._4_4_;
                local_960._0_4_ = fVar76 * auVar35._0_4_;
                local_960._8_4_ = fVar62 * auVar35._8_4_;
                local_960._12_4_ = fVar65 * auVar35._12_4_;
                local_960._16_4_ = fVar66 * 0.0;
                local_960._20_4_ = fVar67 * 0.0;
                local_960._24_4_ = fVar79 * 0.0;
                local_960._28_4_ = 0;
                local_940._4_4_ = fVar78 * auVar36._4_4_;
                local_940._0_4_ = fVar76 * auVar36._0_4_;
                local_940._8_4_ = fVar62 * auVar36._8_4_;
                local_940._12_4_ = fVar65 * auVar36._12_4_;
                local_940._16_4_ = fVar66 * 0.0;
                local_940._20_4_ = fVar67 * 0.0;
                local_940._24_4_ = fVar79 * 0.0;
                local_940._28_4_ = 0;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0075d660:
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    return bVar16;
                  }
                  auVar71._8_4_ = 1;
                  auVar71._0_8_ = 0x100000001;
                  auVar71._12_4_ = 1;
                  auVar71._16_4_ = 1;
                  auVar71._20_4_ = 1;
                  auVar71._24_4_ = 1;
                  auVar71._28_4_ = 1;
                  auVar41 = vpermd_avx2(auVar71,ZEXT1632(auVar57));
                  auVar55 = vpaddd_avx2(auVar41,_DAT_01fec4c0);
                  auVar61._0_4_ = auVar57._0_4_;
                  auVar61._4_4_ = auVar61._0_4_;
                  auVar61._8_4_ = auVar61._0_4_;
                  auVar61._12_4_ = auVar61._0_4_;
                  auVar61._16_4_ = auVar61._0_4_;
                  auVar61._20_4_ = auVar61._0_4_;
                  auVar61._24_4_ = auVar61._0_4_;
                  auVar61._28_4_ = auVar61._0_4_;
                  auVar41 = vpaddd_avx2(auVar61,_DAT_01fec4a0);
                  auVar36 = auVar92._0_16_;
                  auVar34 = vcvtsi2ss_avx512f(auVar36,*(ushort *)(lVar4 + 8 + lVar24) - 1);
                  auVar15._12_4_ = 0;
                  auVar15._0_12_ = ZEXT812(0);
                  auVar35 = vrcp14ss_avx512f(auVar15 << 0x20,ZEXT416(auVar34._0_4_));
                  auVar34 = vfnmadd213ss_fma(auVar34,auVar35,SUB6416(ZEXT464(0x40000000),0));
                  fVar76 = auVar35._0_4_ * auVar34._0_4_;
                  auVar34 = vcvtsi2ss_avx512f(auVar36,*(ushort *)(lVar4 + 10 + lVar24) - 1);
                  auVar35 = vrcp14ss_avx512f(auVar15 << 0x20,ZEXT416(auVar34._0_4_));
                  auVar34 = vfnmadd213ss_fma(auVar34,auVar35,SUB6416(ZEXT464(0x40000000),0));
                  fVar78 = auVar35._0_4_ * auVar34._0_4_;
                  auVar41 = vcvtdq2ps_avx(auVar41);
                  fStack_9c4 = auVar41._28_4_ + local_a80._28_4_;
                  auVar55 = vcvtdq2ps_avx(auVar55);
                  auVar54 = vrcp14ps_avx512vl(local_a20);
                  auVar12._8_4_ = 0x3f800000;
                  auVar12._0_8_ = 0x3f8000003f800000;
                  auVar12._12_4_ = 0x3f800000;
                  auVar12._16_4_ = 0x3f800000;
                  auVar12._20_4_ = 0x3f800000;
                  auVar12._24_4_ = 0x3f800000;
                  auVar12._28_4_ = 0x3f800000;
                  auVar53 = vfnmadd213ps_avx512vl(local_a20,auVar54,auVar12);
                  auVar34 = vfmadd132ps_fma(auVar53,auVar54,auVar54);
                  fVar62 = auVar34._0_4_;
                  fVar65 = auVar34._4_4_;
                  fVar66 = auVar34._8_4_;
                  fVar67 = auVar34._12_4_;
                  local_9a0[0] = fVar62 * local_a40._0_4_;
                  local_9a0[1] = fVar65 * local_a40._4_4_;
                  local_9a0[2] = fVar66 * local_a40._8_4_;
                  local_9a0[3] = fVar67 * local_a40._12_4_;
                  fStack_990 = fVar88 * 0.0;
                  fStack_98c = fVar89 * 0.0;
                  fStack_988 = fVar90 * 0.0;
                  local_9e0[0] = (fVar83 * auVar41._0_4_ + local_a80._0_4_) * fVar76 * fVar62;
                  local_9e0[1] = (fVar85 * auVar41._4_4_ + local_a80._4_4_) * fVar76 * fVar65;
                  local_9e0[2] = (fVar86 * auVar41._8_4_ + local_a80._8_4_) * fVar76 * fVar66;
                  local_9e0[3] = (fVar87 * auVar41._12_4_ + local_a80._12_4_) * fVar76 * fVar67;
                  fStack_9d0 = (fVar88 * auVar41._16_4_ + local_a80._16_4_) * fVar76 * 0.0;
                  fStack_9cc = (fVar89 * auVar41._20_4_ + local_a80._20_4_) * fVar76 * 0.0;
                  fStack_9c8 = (fVar90 * auVar41._24_4_ + local_a80._24_4_) * fVar76 * 0.0;
                  local_9c0[0] = (fVar83 * auVar55._0_4_ + local_a60._0_4_) * fVar78 * fVar62;
                  local_9c0[1] = (fVar85 * auVar55._4_4_ + local_a60._4_4_) * fVar78 * fVar65;
                  local_9c0[2] = (fVar86 * auVar55._8_4_ + local_a60._8_4_) * fVar78 * fVar66;
                  local_9c0[3] = (fVar87 * auVar55._12_4_ + local_a60._12_4_) * fVar78 * fVar67;
                  fStack_9b0 = (fVar88 * auVar55._16_4_ + local_a60._16_4_) * fVar78 * 0.0;
                  fStack_9ac = (fVar89 * auVar55._20_4_ + local_a60._20_4_) * fVar78 * 0.0;
                  fStack_9a8 = (fVar90 * auVar55._24_4_ + local_a60._24_4_) * fVar78 * 0.0;
                  fStack_9a4 = fStack_9c4;
                  uVar22 = 0;
                  uVar29 = (ulong)local_9ff;
                  for (uVar21 = uVar29; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000
                      ) {
                    uVar22 = uVar22 + 1;
                  }
                  local_b20 = vpbroadcastd_avx512vl();
                  local_aa0 = vpbroadcastd_avx512vl();
                  auVar37 = auVar93._0_16_;
                  auVar69 = auVar94._0_16_;
                  auVar57 = auVar95._0_16_;
                  auVar58 = auVar96._0_16_;
                  auVar59 = auVar97._0_16_;
                  auVar34 = vmovdqa64_avx512vl(auVar98._0_16_);
                  auVar35 = vmovdqa64_avx512vl(auVar99._0_16_);
                  local_ac0 = vmovdqa64_avx512vl(auVar100._0_32_);
                  fStack_adc = local_ae0;
                  fStack_ad8 = local_ae0;
                  fStack_ad4 = local_ae0;
                  fStack_ad0 = local_ae0;
                  fStack_acc = local_ae0;
                  fStack_ac8 = local_ae0;
                  fStack_ac4 = local_ae0;
                  do {
                    fVar83 = local_9e0[uVar22];
                    local_8c0._4_4_ = fVar83;
                    local_8c0._0_4_ = fVar83;
                    local_8c0._8_4_ = fVar83;
                    local_8c0._12_4_ = fVar83;
                    local_8c0._16_4_ = fVar83;
                    local_8c0._20_4_ = fVar83;
                    local_8c0._24_4_ = fVar83;
                    local_8c0._28_4_ = fVar83;
                    fVar83 = local_9c0[uVar22];
                    local_8a0._4_4_ = fVar83;
                    local_8a0._0_4_ = fVar83;
                    local_8a0._8_4_ = fVar83;
                    local_8a0._12_4_ = fVar83;
                    local_8a0._16_4_ = fVar83;
                    local_8a0._20_4_ = fVar83;
                    local_8a0._24_4_ = fVar83;
                    local_8a0._28_4_ = fVar83;
                    *(float *)(ray + k * 4 + 0x100) = local_9a0[uVar22];
                    local_b50.context = context->user;
                    local_920 = *(undefined4 *)(local_980 + uVar22 * 4);
                    uVar2 = *(undefined4 *)(local_960 + uVar22 * 4);
                    local_900._4_4_ = uVar2;
                    local_900._0_4_ = uVar2;
                    local_900._8_4_ = uVar2;
                    local_900._12_4_ = uVar2;
                    local_900._16_4_ = uVar2;
                    local_900._20_4_ = uVar2;
                    local_900._24_4_ = uVar2;
                    local_900._28_4_ = uVar2;
                    local_8e0 = *(undefined4 *)(local_940 + uVar22 * 4);
                    uStack_91c = local_920;
                    uStack_918 = local_920;
                    uStack_914 = local_920;
                    uStack_910 = local_920;
                    uStack_90c = local_920;
                    uStack_908 = local_920;
                    uStack_904 = local_920;
                    uStack_8dc = local_8e0;
                    uStack_8d8 = local_8e0;
                    uStack_8d4 = local_8e0;
                    uStack_8d0 = local_8e0;
                    uStack_8cc = local_8e0;
                    uStack_8c8 = local_8e0;
                    uStack_8c4 = local_8e0;
                    local_880 = local_aa0._0_8_;
                    uStack_878 = local_aa0._8_8_;
                    uStack_870 = local_aa0._16_8_;
                    uStack_868 = local_aa0._24_8_;
                    local_860 = local_b20;
                    vpcmpeqd_avx2(local_b20,local_b20);
                    uStack_83c = (local_b50.context)->instID[0];
                    local_840 = uStack_83c;
                    uStack_838 = uStack_83c;
                    uStack_834 = uStack_83c;
                    uStack_830 = uStack_83c;
                    uStack_82c = uStack_83c;
                    uStack_828 = uStack_83c;
                    uStack_824 = uStack_83c;
                    uStack_81c = (local_b50.context)->instPrimID[0];
                    local_820 = uStack_81c;
                    uStack_818 = uStack_81c;
                    uStack_814 = uStack_81c;
                    uStack_810 = uStack_81c;
                    uStack_80c = uStack_81c;
                    uStack_808 = uStack_81c;
                    uStack_804 = uStack_81c;
                    local_b00 = vmovdqa64_avx512vl(auVar100._0_32_);
                    local_b50.valid = (int *)local_b00;
                    local_b50.geometryUserPtr = pGVar3->userPtr;
                    local_b50.hit = (RTCHitN *)&local_920;
                    local_b50.N = 8;
                    auVar41 = vmovdqa64_avx512vl(auVar100._0_32_);
                    local_b50.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->occlusionFilterN)(&local_b50);
                      auVar41 = local_b00;
                    }
                    if (auVar41 == (undefined1  [32])0x0) {
                      auVar38 = vmovdqa64_avx512vl(auVar34);
                      auVar39 = vmovdqa64_avx512vl(auVar35);
                      auVar54 = vmovdqa64_avx512vl(local_ac0);
                      auVar40 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    }
                    else {
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var6)(&local_b50);
                        auVar41 = local_b00;
                      }
                      uVar21 = vptestmd_avx512vl(auVar41,auVar41);
                      auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar32 = (bool)((byte)uVar21 & 1);
                      auVar56._0_4_ =
                           (uint)bVar32 * auVar55._0_4_ |
                           (uint)!bVar32 * *(int *)(local_b50.ray + 0x100);
                      bVar32 = (bool)((byte)(uVar21 >> 1) & 1);
                      auVar56._4_4_ =
                           (uint)bVar32 * auVar55._4_4_ |
                           (uint)!bVar32 * *(int *)(local_b50.ray + 0x104);
                      bVar32 = (bool)((byte)(uVar21 >> 2) & 1);
                      auVar56._8_4_ =
                           (uint)bVar32 * auVar55._8_4_ |
                           (uint)!bVar32 * *(int *)(local_b50.ray + 0x108);
                      bVar32 = (bool)((byte)(uVar21 >> 3) & 1);
                      auVar56._12_4_ =
                           (uint)bVar32 * auVar55._12_4_ |
                           (uint)!bVar32 * *(int *)(local_b50.ray + 0x10c);
                      bVar32 = (bool)((byte)(uVar21 >> 4) & 1);
                      auVar56._16_4_ =
                           (uint)bVar32 * auVar55._16_4_ |
                           (uint)!bVar32 * *(int *)(local_b50.ray + 0x110);
                      bVar32 = (bool)((byte)(uVar21 >> 5) & 1);
                      auVar56._20_4_ =
                           (uint)bVar32 * auVar55._20_4_ |
                           (uint)!bVar32 * *(int *)(local_b50.ray + 0x114);
                      bVar32 = (bool)((byte)(uVar21 >> 6) & 1);
                      auVar56._24_4_ =
                           (uint)bVar32 * auVar55._24_4_ |
                           (uint)!bVar32 * *(int *)(local_b50.ray + 0x118);
                      bVar32 = SUB81(uVar21 >> 7,0);
                      auVar56._28_4_ =
                           (uint)bVar32 * auVar55._28_4_ |
                           (uint)!bVar32 * *(int *)(local_b50.ray + 0x11c);
                      *(undefined1 (*) [32])(local_b50.ray + 0x100) = auVar56;
                      auVar38 = vmovdqa64_avx512vl(auVar34);
                      auVar39 = vmovdqa64_avx512vl(auVar35);
                      auVar54 = vmovdqa64_avx512vl(local_ac0);
                      auVar40 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      if (auVar41 != (undefined1  [32])0x0) goto LAB_0075d660;
                    }
                    auVar102 = ZEXT3264(auVar55);
                    auVar101 = ZEXT1664(auVar40);
                    auVar100 = ZEXT3264(auVar54);
                    auVar99 = ZEXT1664(auVar39);
                    auVar98 = ZEXT1664(auVar38);
                    auVar97 = ZEXT1664(auVar59);
                    auVar96 = ZEXT1664(auVar58);
                    auVar95 = ZEXT1664(auVar57);
                    auVar94 = ZEXT1664(auVar69);
                    auVar93 = ZEXT1664(auVar37);
                    auVar92 = ZEXT1664(auVar36);
                    *(float *)(ray + k * 4 + 0x100) = local_ae0;
                    uVar21 = uVar22 & 0x3f;
                    uVar22 = 0;
                    uVar29 = uVar29 ^ 1L << uVar21;
                    for (uVar21 = uVar29; (uVar21 & 1) == 0;
                        uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                      uVar22 = uVar22 + 1;
                    }
                  } while (uVar29 != 0);
                }
              }
            }
            uVar17 = uVar17 - 1 & uVar17;
          } while (uVar17 != 0);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != uVar33 - 8);
    }
joined_r0x0075ccab:
    bVar16 = puVar25 != &local_800;
    if (!bVar16) {
      return bVar16;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }